

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

void __thiscall ipx::SparseMatrix::SortIndices(SparseMatrix *this)

{
  pointer piVar1;
  pointer pdVar2;
  bool bVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> work;
  allocator_type local_31;
  _Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  
  bVar3 = IsSorted(this);
  if (!bVar3) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_30
               ,(long)this->nrow_,&local_31);
    piVar4 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = 0;
        lVar8 < ((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar4) * 0x40000000 + -0x100000000
                >> 0x20; lVar8 = lVar8 + 1) {
      piVar1 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      for (lVar5 = (long)piVar4[lVar8]; lVar5 < piVar4[lVar8 + 1]; lVar5 = lVar5 + 1) {
        *(int *)((long)&(local_30._M_impl.super__Vector_impl_data._M_start)->first + lVar6) =
             piVar1[lVar5];
        *(double *)((long)&(local_30._M_impl.super__Vector_impl_data._M_start)->second + lVar6) =
             pdVar2[lVar5];
        lVar6 = lVar6 + 0x10;
      }
      pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
                (local_30._M_impl.super__Vector_impl_data._M_start,
                 (long)&(local_30._M_impl.super__Vector_impl_data._M_start)->first + lVar6);
      piVar4 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = &(local_30._M_impl.super__Vector_impl_data._M_start)->second;
      for (lVar5 = (long)piVar4[lVar8]; lVar5 < piVar4[lVar8 + 1]; lVar5 = lVar5 + 1) {
        piVar1[lVar5] = ((pair<int,_double> *)(pdVar7 + -1))->first;
        pdVar2[lVar5] = *pdVar7;
        pdVar7 = pdVar7 + 2;
      }
    }
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&local_30);
  }
  return;
}

Assistant:

void SparseMatrix::SortIndices() {
    if (IsSorted())
        return;
    std::vector<std::pair<Int,double>> work(rows());
    for (Int j = 0; j < cols(); j++) {
        Int nz = 0;             // # entries in column j
        for (Int p = begin(j); p < end(j); p++) {
            work[nz].first = index(p);
            work[nz].second = value(p);
            nz++;
        }
        pdqsort(work.begin(), work.begin() + nz);
        for (Int k = 0, p = begin(j); p < end(j); k++, p++) {
            index(p) = work[k].first;
            value(p) = work[k].second;
        }
    }
}